

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMAttrMapImpl.cpp
# Opt level: O2

void __thiscall xercesc_4_0::DOMAttrMapImpl::setNamedItemFast(DOMAttrMapImpl *this,DOMNode *arg)

{
  int iVar1;
  uint uVar2;
  DOMNodeImpl *pDVar3;
  undefined4 extraout_var;
  
  pDVar3 = castToNodeImpl(arg);
  pDVar3->fOwnerNode = this->fOwnerNode;
  pDVar3->flags = pDVar3->flags | 8;
  iVar1 = (*arg->_vptr_DOMNode[2])(arg);
  uVar2 = (*(this->super_DOMNamedNodeMap)._vptr_DOMNamedNodeMap[0xe])
                    (this,CONCAT44(extraout_var,iVar1));
  if (-1 < (int)uVar2) {
    DOMNodeVector::setElementAt(this->fNodes,arg,(ulong)uVar2);
    return;
  }
  DOMNodeVector::insertElementAt(this->fNodes,arg,(ulong)~uVar2);
  return;
}

Assistant:

void DOMAttrMapImpl::setNamedItemFast(DOMNode *arg)
{
    DOMNodeImpl *argImpl = castToNodeImpl(arg);

    argImpl->fOwnerNode = fOwnerNode;
    argImpl->isOwned(true);
    int i = findNamePoint(arg->getNodeName());

    if(i >= 0)
      fNodes->setElementAt(arg, i);
    else
    {
      i= -1 -i;
      fNodes->insertElementAt(arg, i);
    }
}